

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webclient.cpp
# Opt level: O3

request * warhawk::common::request::default_post
                    (request *__return_storage_ptr__,string *url_,string *data_)

{
  _Rb_tree_header *p_Var1;
  
  (__return_storage_ptr__->m_url)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_url).field_2;
  (__return_storage_ptr__->m_url)._M_string_length = 0;
  (__return_storage_ptr__->m_url).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_method)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_method).field_2;
  (__return_storage_ptr__->m_method)._M_string_length = 0;
  (__return_storage_ptr__->m_method).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_data)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_data).field_2;
  (__return_storage_ptr__->m_data)._M_string_length = 0;
  (__return_storage_ptr__->m_data).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  p_Var1 = &(__return_storage_ptr__->m_headers)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (__return_storage_ptr__->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->m_headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->m_method,0,(char *)0x0,0x110d2c);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)url_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_data,(string *)data_);
  __return_storage_ptr__->m_follow_redirect = true;
  return __return_storage_ptr__;
}

Assistant:

request request::default_post( std::string url_, std::string data_ )
{
  request r;
  r.m_method = "POST";
  r.m_url = std::move( url_ );
  r.m_data = std::move( data_ );
  r.m_follow_redirect = true;
  return r;
}